

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixels
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong maxScanLineSize;
  char *base;
  size_t sVar4;
  size_t sVar5;
  Data *pDVar6;
  int iVar7;
  uint uVar8;
  Compression *pCVar9;
  Slice *pSVar10;
  ChannelList *this_00;
  const_iterator cVar11;
  const_iterator cVar12;
  ConstIterator CVar13;
  ConstIterator CVar14;
  int *piVar15;
  int yStride;
  int iVar16;
  int xStride;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  char *uncompressed_data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsetInLineBuffer;
  char *readPtr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  Format local_bc;
  Compressor *local_98;
  char *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_60;
  ulong local_58;
  char *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar17 = *(uint *)rawPixelData;
  lVar3 = *(long *)(rawPixelData + 4);
  uVar19 = *(ulong *)(rawPixelData + 0xc);
  maxScanLineSize = *(ulong *)(rawPixelData + 0x14);
  if (uVar19 < maxScanLineSize) {
    pCVar9 = Header::compression(&this->_data->header);
    local_98 = newCompressor(*pCVar9,maxScanLineSize,&this->_data->header);
    (*local_98->_vptr_Compressor[6])
              (local_98,rawPixelData + lVar3 + 0x1c,uVar19 & 0xffffffff,(ulong)uVar17,&local_80);
    local_bc = (*local_98->_vptr_Compressor[3])(local_98);
  }
  else {
    local_80 = rawPixelData + lVar3 + 0x1c;
    local_bc = XDR;
    local_98 = (Compressor *)0x0;
  }
  bVar20 = this->_data->lineOrder == INCREASING_Y;
  iVar7 = scanLine1 + -1;
  if (bVar20) {
    iVar7 = scanLine2 + 1;
    scanLine2 = scanLine1;
  }
  pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  base = pSVar10->base;
  pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  sVar4 = pSVar10->xStride;
  pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  sVar5 = pSVar10->yStride;
  pDVar6 = this->_data;
  iVar18 = pDVar6->maxY;
  iVar16 = uVar17 + pDVar6->linesInBuffer + -1;
  if (iVar18 < iVar16) {
    iVar16 = iVar18;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(long)((iVar18 - pDVar6->minY) + 1),(allocator_type *)&local_78);
  yStride = (int)sVar5;
  xStride = (int)sVar4;
  bytesPerDeepLineTable(&this->_data->header,uVar17,iVar16,base,xStride,yStride,&local_48);
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar18 = this->_data->minY;
  offsetInLineBufferTable
            (&local_48,uVar17 - iVar18,iVar16 - iVar18,this->_data->linesInBuffer,&local_78);
  this_00 = Header::channels(&this->_data->header);
  if (scanLine2 != iVar7) {
    local_60 = (ulong)bVar20 * 2 + -1;
    uVar19 = (ulong)scanLine2;
    do {
      local_50 = local_80 +
                 local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19 - (long)this->_data->minY];
      cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
      cVar12._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
      uVar17 = (uint)uVar19;
      local_58 = (ulong)~uVar17;
      iVar18 = -1;
      for (; CVar13 = DeepFrameBuffer::end(frameBuffer),
          (const_iterator)cVar12._M_node != CVar13._i._M_node;
          cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
        while ((CVar14 = ChannelList::end(this_00),
               (const_iterator)cVar11._M_node != CVar14._i._M_node &&
               (iVar16 = strcmp((char *)(cVar11._M_node + 1),(char *)(cVar12._M_node + 1)),
               iVar16 < 0))) {
          if (iVar18 == -1) {
            iVar16 = this->_data->minX;
            iVar1 = this->_data->maxX;
            iVar18 = 0;
            if (iVar16 <= iVar1) {
              piVar15 = (int *)(base + (long)(iVar16 * xStride) + uVar19 * (long)yStride);
              iVar16 = (iVar1 - iVar16) + 1;
              iVar18 = 0;
              do {
                iVar18 = iVar18 + *piVar15;
                piVar15 = (int *)((long)piVar15 + (long)xStride);
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
          }
          skipChannel(&local_50,cVar11._M_node[9]._M_color,(long)iVar18);
          cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        }
        CVar14 = ChannelList::end(this_00);
        if (((const_iterator)cVar11._M_node == CVar14._i._M_node) ||
           (iVar16 = strcmp((char *)(cVar11._M_node + 1),(char *)(cVar12._M_node + 1)), 0 < iVar16))
        {
          bVar20 = true;
        }
        else {
          bVar20 = false;
        }
        uVar2 = *(uint *)&cVar11._M_node[9]._M_parent;
        if ((long)uVar19 < 0) {
          if ((int)uVar2 < 0) {
            uVar8 = (~uVar2 - uVar17) / -uVar2;
          }
          else {
            uVar8 = -(((int)local_58 + uVar2) / uVar2);
          }
        }
        else if ((int)uVar2 < 0) {
          uVar8 = -(int)((uVar19 & 0xffffffff) / (ulong)-uVar2);
        }
        else {
          uVar8 = (uint)((uVar19 & 0xffffffff) / (ulong)uVar2);
        }
        if (uVar8 * uVar2 == uVar17) {
          copyIntoDeepFrameBuffer
                    (&local_50,(char *)cVar12._M_node[9]._M_parent,base,(long)xStride,(long)yStride,
                     uVar17,this->_data->minX,this->_data->maxX,0,0,0,0,
                     (long)*(int *)((long)&cVar12._M_node[10]._M_left + 4),
                     (ptrdiff_t)cVar12._M_node[9]._M_left,(ptrdiff_t)cVar12._M_node[9]._M_right,
                     bVar20,(double)cVar12._M_node[10]._M_parent,local_bc,cVar12._M_node[9]._M_color
                     ,cVar11._M_node[9]._M_color);
          cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        }
      }
      uVar19 = uVar19 + local_60;
    } while (iVar7 != (int)uVar19);
  }
  if (local_98 != (Compressor *)0x0) {
    (*local_98->_vptr_Compressor[1])();
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);
    uint64_t packedDataSize           = *(uint64_t*) (rawPixelData + 12);
    uint64_t unpackedDataSize         = *(uint64_t*) (rawPixelData + 20);

    //
    // Uncompress the data, if necessary
    //

    Compressor*        decomp = NULL;
    const char*        uncompressed_data;
    Compressor::Format format = Compressor::XDR;
    if (packedDataSize < unpackedDataSize)
    {
        decomp = newCompressor (
            _data->header.compression (), unpackedDataSize, _data->header);

        decomp->uncompress (
            rawPixelData + 28 + sampleCountTableDataSize,
            static_cast<int> (packedDataSize),
            data_scanline,
            uncompressed_data);
        format = decomp->format ();
    }
    else
    {
        //
        // If the line is uncompressed, it's in XDR format,
        // regardless of the compressor's output format.
        //

        format            = Compressor::XDR;
        uncompressed_data = rawPixelData + 28 + sampleCountTableDataSize;
    }

    int yStart, yStop, dy;

    if (_data->lineOrder == INCREASING_Y)
    {
        yStart = scanLine1;
        yStop  = scanLine2 + 1;
        dy     = 1;
    }
    else
    {
        yStart = scanLine2;
        yStop  = scanLine1 - 1;
        dy     = -1;
    }

    const char* samplecount_base = frameBuffer.getSampleCountSlice ().base;
    int         samplecount_xstride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int samplecount_ystride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    //
    // For each line within the block, get the count of bytes.
    //

    int minYInLineBuffer = data_scanline;
    int maxYInLineBuffer =
        min (minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

    vector<size_t> bytesPerLine (1 + _data->maxY - _data->minY);

    bytesPerDeepLineTable (
        _data->header,
        minYInLineBuffer,
        maxYInLineBuffer,
        samplecount_base,
        samplecount_xstride,
        samplecount_ystride,
        bytesPerLine);

    //
    // For each scanline within the block, get the offset.
    //

    vector<size_t> offsetInLineBuffer;
    offsetInLineBufferTable (
        bytesPerLine,
        minYInLineBuffer - _data->minY,
        maxYInLineBuffer - _data->minY,
        _data->linesInBuffer,
        offsetInLineBuffer);

    const ChannelList& channels = header ().channels ();

    for (int y = yStart; y != yStop; y += dy)
    {

        const char* readPtr =
            uncompressed_data + offsetInLineBuffer[y - _data->minY];

        //
        // need to know the total number of samples on a scanline to skip channels
        // compute on demand: -1 means uncomputed
        //
        int lineSampleCount = -1;

        //
        // Iterate over all image channels in frame buffer
        //

        ChannelList::ConstIterator i = channels.begin ();

        for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
             j != frameBuffer.end ();
             ++j)
        {
            while (i != channels.end () && strcmp (i.name (), j.name ()) < 0)
            {
                //
                // Channel i is present in the file but not
                // in the frame buffer; skip

                if (lineSampleCount == -1)
                {
                    lineSampleCount = 0;
                    const char* ptr =
                        (samplecount_base + y * samplecount_ystride +
                         samplecount_xstride * _data->minX);
                    for (int x = _data->minX; x <= _data->maxX; x++)
                    {

                        lineSampleCount += *(const unsigned int*) ptr;
                        ptr += samplecount_xstride;
                    }
                }

                skipChannel (readPtr, i.channel ().type, lineSampleCount);

                ++i;
            }

            bool fill = false;

            if (i == channels.end () || strcmp (i.name (), j.name ()) > 0)
            {
                //
                // Channel i is present in the frame buffer, but not in the file.
                // In the frame buffer, slice j will be filled with a default value.
                //

                fill = true;
            }
            if (modp (y, i.channel ().ySampling) == 0)
            {

                copyIntoDeepFrameBuffer (
                    readPtr,
                    j.slice ().base,
                    samplecount_base,
                    samplecount_xstride,
                    samplecount_ystride,
                    y,
                    _data->minX,
                    _data->maxX,
                    0,
                    0,
                    0,
                    0,
                    j.slice ().sampleStride,
                    j.slice ().xStride,
                    j.slice ().yStride,
                    fill,
                    j.slice ().fillValue,
                    format,
                    j.slice ().type,
                    i.channel ().type);

                ++i;
            }
        } //next slice in framebuffer
    }     //next row in image

    //
    // clean up
    //

    delete decomp;
}